

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::PointCase::iterate(PointCase *this)

{
  size_type *psVar1;
  ulong uVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  ostringstream *poVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  size_t **ppsVar9;
  bool bVar10;
  int iVar11;
  long *plVar12;
  undefined8 *puVar13;
  pointer pVVar14;
  ulong *puVar15;
  char *description;
  IterateResult IVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float extraout_XMM0_Da;
  float fVar21;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar22;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> points;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  RasterizationArguments args;
  PointSceneSpec scene;
  undefined1 local_268 [24];
  long lStack_250;
  undefined1 local_248 [36];
  float local_224;
  Surface local_220;
  long lStack_208;
  string local_200;
  ScopedLogSection local_1e0;
  RasterizationArguments local_1d8;
  undefined4 uStack_1c4;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  iVar11 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<((ostringstream *)local_1b8,iVar11 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)local_248,0,(char *)0x0,0xb032c6);
  pVVar14 = (pointer)(plVar12 + 2);
  if ((pointer)*plVar12 == pVVar14) {
    local_268._16_8_ = *(undefined8 *)pVVar14->m_data;
    lStack_250 = plVar12[3];
    local_268._0_8_ = (pointer)(local_268 + 0x10);
  }
  else {
    local_268._16_8_ = *(undefined8 *)pVVar14->m_data;
    local_268._0_8_ = (pointer)*plVar12;
  }
  local_268._8_8_ = plVar12[1];
  *plVar12 = (long)pVVar14;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append(local_268);
  ppsVar9 = (size_t **)&local_220.m_pixels.m_cap;
  puVar15 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar15) {
    local_220.m_pixels.m_cap = *puVar15;
    lStack_208 = plVar12[3];
    local_220._0_8_ = ppsVar9;
  }
  else {
    local_220.m_pixels.m_cap = *puVar15;
    local_220._0_8_ = (ulong *)*plVar12;
  }
  local_220.m_pixels.m_ptr = (void *)plVar12[1];
  *plVar12 = (long)puVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  std::ostream::operator<<(local_1b8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  uVar2 = CONCAT44(local_1d8.greenBits,local_1d8.redBits) + (long)local_220.m_pixels.m_ptr;
  uVar17 = 0xf;
  if ((size_t **)local_220._0_8_ != ppsVar9) {
    uVar17 = local_220.m_pixels.m_cap;
  }
  if (uVar17 < uVar2) {
    uVar17 = 0xf;
    if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
      uVar17 = CONCAT44(uStack_1c4,local_1d8.blueBits);
    }
    if (uVar17 < uVar2) goto LAB_004553df;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_220._0_8_);
  }
  else {
LAB_004553df:
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_220,CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples));
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar1 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200.field_2._8_8_ = puVar13[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_200._M_string_length = puVar13[1];
  *puVar13 = psVar1;
  puVar13[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples),
                    CONCAT44(uStack_1c4,local_1d8.blueBits) + 1);
  }
  if ((size_t **)local_220._0_8_ != ppsVar9) {
    operator_delete((void *)local_220._0_8_,local_220.m_pixels.m_cap + 1);
  }
  if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
    operator_delete((void *)local_268._0_8_,(ulong)((long)(float *)local_268._16_8_ + 1));
  }
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)((Vec4 *)local_248._16_8_)->m_data + 1));
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1e0,
             ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             )->m_log,&local_200,&local_200);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this);
  iVar11 = (this->super_BaseRenderingCase).m_renderSize;
  local_224 = extraout_XMM0_Da;
  tcu::Surface::Surface(&local_220,iVar11,iVar11);
  local_268._0_8_ = (pointer)0x0;
  local_268._8_8_ = (pointer)0x0;
  local_268._16_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  if (this->m_maxPointSize < local_224) {
    local_1b8._0_8_ =
         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar5 = (ostringstream *)(local_1b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Point size ",0xb);
    std::ostream::_M_insert<double>((double)local_224);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_140);
    goto LAB_004559db;
  }
  iVar11 = *(int *)&(this->super_BaseRenderingCase).field_0xc4;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_268,6);
  if (iVar11 == 2) {
    ((float *)local_268._0_8_)[0] = -0.9;
    ((float *)local_268._0_8_)[1] = -0.3;
    ((float *)local_268._0_8_)[2] = 0.0;
    ((float *)local_268._0_8_)[3] = 1.0;
    ((pointer)(local_268._0_8_ + 0x10))->m_data[0] = 0.3;
    ((pointer)(local_268._0_8_ + 0x10))->m_data[1] = -0.9;
    ((pointer)(local_268._0_8_ + 0x10))->m_data[2] = 0.0;
    ((pointer)(local_268._0_8_ + 0x10))->m_data[3] = 1.0;
    ((pointer)(local_268._0_8_ + 0x20))->m_data[0] = -0.4;
    ((pointer)(local_268._0_8_ + 0x20))->m_data[1] = -0.1;
    ((pointer)(local_268._0_8_ + 0x20))->m_data[2] = 0.0;
    ((pointer)(local_268._0_8_ + 0x20))->m_data[3] = 1.0;
    ((pointer)(local_268._0_8_ + 0x30))->m_data[0] = -0.11;
    ((pointer)(local_268._0_8_ + 0x30))->m_data[1] = 0.2;
    ((pointer)(local_268._0_8_ + 0x30))->m_data[2] = 0.0;
    ((pointer)(local_268._0_8_ + 0x30))->m_data[3] = 1.0;
    ((pointer)(local_268._0_8_ + 0x40))->m_data[0] = 0.88;
    ((pointer)(local_268._0_8_ + 0x40))->m_data[1] = 0.7;
    ((pointer)(local_268._0_8_ + 0x40))->m_data[2] = 0.0;
    ((pointer)(local_268._0_8_ + 0x40))->m_data[3] = 1.0;
    fVar21 = 0.4;
LAB_004556d2:
    fVar22 = -0.4;
LAB_004556da:
    ((pointer)(local_268._0_8_ + 0x50))->m_data[0] = fVar22;
    ((pointer)(local_268._0_8_ + 0x50))->m_data[1] = fVar21;
    ((pointer)(local_268._0_8_ + 0x50))->m_data[2] = 0.0;
    ((pointer)(local_268._0_8_ + 0x50))->m_data[3] = 1.0;
  }
  else {
    if (iVar11 == 1) {
      ((float *)local_268._0_8_)[0] = -0.499;
      ((float *)local_268._0_8_)[1] = 0.128;
      ((float *)local_268._0_8_)[2] = 0.0;
      ((float *)local_268._0_8_)[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[0] = -0.501;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[1] = -0.3;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[0] = 0.11;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[1] = -0.2;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[0] = 0.11;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[1] = 0.2;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[0] = 0.88;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[1] = 0.9;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[3] = 1.0;
      fVar21 = 1.2;
      fVar22 = 0.4;
      goto LAB_004556da;
    }
    if (iVar11 == 0) {
      ((float *)local_268._0_8_)[0] = 0.2;
      ((float *)local_268._0_8_)[1] = 0.8;
      ((float *)local_268._0_8_)[2] = 0.0;
      ((float *)local_268._0_8_)[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[0] = 0.5;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[1] = 0.2;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x10))->m_data[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[0] = 0.5;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[1] = 0.3;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x20))->m_data[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[0] = -0.5;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[1] = 0.2;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x30))->m_data[3] = 1.0;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[0] = -0.2;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[1] = -0.4;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[2] = 0.0;
      ((pointer)(local_268._0_8_ + 0x40))->m_data[3] = 1.0;
      fVar21 = 0.2;
      goto LAB_004556d2;
    }
  }
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  resize((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)local_248,(long)(local_268._8_8_ - local_268._0_8_) >> 4);
  if (0 < (int)((ulong)(local_248._8_8_ - local_248._0_8_) >> 2) * 0x38e38e39) {
    lVar19 = 0;
    lVar20 = 0;
    lVar18 = 0;
    do {
      puVar3 = (undefined4 *)((long)(float *)local_268._0_8_ + lVar19);
      uVar6 = puVar3[1];
      uVar7 = puVar3[2];
      uVar8 = puVar3[3];
      puVar4 = (undefined4 *)((long)((Vec4 *)local_248._0_8_)->m_data + lVar20);
      *puVar4 = *puVar3;
      puVar4[1] = uVar6;
      puVar4[2] = uVar7;
      puVar4[3] = uVar8;
      (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
        [6])(this);
      *(undefined4 *)((long)((Vec4 *)(local_248._0_8_ + 0x10) + 1) + lVar20) = extraout_XMM0_Da_00;
      lVar18 = lVar18 + 1;
      lVar20 = lVar20 + 0x24;
      lVar19 = lVar19 + 0x10;
    } while (lVar18 < (int)((ulong)(local_248._8_8_ - local_248._0_8_) >> 2) * 0x38e38e39);
  }
  local_1b8._0_8_ =
       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar5 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Rendering ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar5," point(s): (point size = ",0x19);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this);
  std::ostream::_M_insert<double>((double)extraout_XMM0_Da_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_140);
  if (0 < (int)((ulong)(local_248._8_8_ - local_248._0_8_) >> 2) * 0x38e38e39) {
    poVar5 = (ostringstream *)(local_1b8 + 8);
    lVar18 = 0;
    lVar19 = 0;
    do {
      local_1b8._0_8_ =
           ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Point ",6);
      lVar19 = lVar19 + 1;
      std::ostream::operator<<(poVar5,(int)lVar19);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,":\t",2);
      tcu::operator<<((ostream *)poVar5,
                      (Vector<float,_4> *)((long)((Vec4 *)local_248._0_8_)->m_data + lVar18));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar5);
      std::ios_base::~ios_base(local_140);
      lVar18 = lVar18 + 0x24;
    } while (lVar19 < (int)((ulong)(local_248._8_8_ - local_248._0_8_) >> 2) * 0x38e38e39);
  }
  BaseRenderingCase::drawPrimitives
            (&this->super_BaseRenderingCase,&local_220,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_268,0);
  local_1d8.numSamples = (this->super_BaseRenderingCase).m_numSamples;
  local_1d8.subpixelBits = (this->super_BaseRenderingCase).m_subpixelBits;
  local_1d8.redBits = (this->super_BaseRenderingCase).m_pixelFormat.redBits;
  local_1d8.greenBits = (this->super_BaseRenderingCase).m_pixelFormat.greenBits;
  local_1d8.blueBits = (this->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_1b8._0_8_ = local_248._0_8_;
  local_1b8._8_8_ = local_248._8_8_;
  local_1a8 = (pointer)local_248._16_8_;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  bVar10 = tcu::verifyPointGroupRasterization
                     (&local_220,(PointSceneSpec *)local_1b8,&local_1d8,
                      ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx)->m_log);
  if (!bVar10) {
    this->m_allIterationsPassed = false;
  }
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
  }
LAB_004559db:
  iVar11 = *(int *)&(this->super_BaseRenderingCase).field_0xc4 + 1;
  *(int *)&(this->super_BaseRenderingCase).field_0xc4 = iVar11;
  IVar16 = CONTINUE;
  if (iVar11 == this->m_iterationCount) {
    description = "Incorrect rasterization";
    if (this->m_allIterationsPassed != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    IVar16 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,this->m_allIterationsPassed ^ QP_TEST_RESULT_FAIL,description);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  if ((pointer)local_268._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
  }
  tcu::Surface::~Surface(&local_220);
  tcu::TestLog::endSection(local_1e0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return IVar16;
}

Assistant:

PointCase::IterateResult PointCase::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), iterationDescription, iterationDescription);
	const float								pointSize				= getPointSize();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<PointSceneSpec::ScenePoint>	points;

	// supported?
	if (pointSize <= m_maxPointSize)
	{
		// gen data
		generatePoints(m_iteration, drawBuffer, points);

		// draw image
		drawPrimitives(resultImage, drawBuffer, GL_POINTS);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			PointSceneSpec			scene;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.points.swap(points);

			compareOk = verifyPointGroupRasterization(resultImage, scene, args, m_testCtx.getLog());

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Point size " << pointSize << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect rasterization");

		return STOP;
	}
	else
		return CONTINUE;
}